

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.hpp
# Opt level: O3

__pid_t __thiscall tlx::Semaphore::wait(Semaphore *this,void *__stat_loc)

{
  long in_RDX;
  ulong uVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->mutex_;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  uVar1 = this->value_;
  if (uVar1 < (ulong)(in_RDX + (long)__stat_loc)) {
    do {
      std::condition_variable::wait((unique_lock *)&this->cv_);
      uVar1 = this->value_;
    } while (uVar1 < (ulong)(in_RDX + (long)__stat_loc));
  }
  this->value_ = uVar1 - (long)__stat_loc;
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return (__pid_t)(uVar1 - (long)__stat_loc);
}

Assistant:

size_t wait(size_t delta = 1, size_t slack = 0) {
        std::unique_lock<std::mutex> lock(mutex_);
        while (value_ < delta + slack)
            cv_.wait(lock);
        value_ -= delta;
        return value_;
    }